

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_service.h
# Opt level: O2

t_function * __thiscall t_service::get_function_by_name(t_service *this,string *func_name)

{
  t_service *this_00;
  __type _Var1;
  t_function *ptVar2;
  pointer pptVar3;
  string local_40;
  
  this_00 = this->extends_;
  if (this_00 != (t_service *)0x0) {
    std::__cxx11::string::string((string *)&local_40,(string *)func_name);
    ptVar2 = get_function_by_name(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (ptVar2 != (t_function *)0x0) {
      return ptVar2;
    }
  }
  pptVar3 = (this->functions_).super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pptVar3 ==
        (this->functions_).super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return (t_function *)0x0;
    }
    _Var1 = std::operator==(&(*pptVar3)->name_,func_name);
    if (_Var1) break;
    pptVar3 = pptVar3 + 1;
  }
  return *pptVar3;
}

Assistant:

t_function* get_function_by_name(std::string func_name) {
    if (extends_ != NULL) {
      t_function* func = NULL;
      if ((func = extends_->get_function_by_name(func_name)) != NULL) {
        return func;
      }
    }

    std::vector<t_function*>::const_iterator iter;
    for (iter = functions_.begin(); iter != functions_.end(); ++iter) {
      if ((*iter)->get_name() == func_name) {
        return *iter;
      }
    }
    return NULL;
  }